

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReverseLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reverse(NeuralNetworkLayer *this)

{
  ReverseLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3c0) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3c0;
    this_00 = (ReverseLayerParams *)operator_new(0x28);
    ReverseLayerParams::ReverseLayerParams(this_00);
    (this->layer_).reverse_ = this_00;
  }
  return (ReverseLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReverseLayerParams* NeuralNetworkLayer::mutable_reverse() {
  if (!has_reverse()) {
    clear_layer();
    set_has_reverse();
    layer_.reverse_ = new ::CoreML::Specification::ReverseLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reverse)
  return layer_.reverse_;
}